

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[3],std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                   (string *__return_storage_ptr__,char (*a) [3],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,char *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  char local_a8 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_88;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  size_type local_40;
  pointer local_38;
  undefined8 local_30;
  
  local_88.first._M_len = strlen(*a);
  local_88.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68 = (b->_M_dataplus)._M_p;
  local_70 = b->_M_string_length;
  local_60 = 0;
  local_a8[0] = *args;
  local_50 = local_a8;
  local_58 = 1;
  local_48 = 0;
  local_38 = (args_1->_M_dataplus)._M_p;
  local_40 = args_1->_M_string_length;
  local_30 = 0;
  views._M_len = 4;
  views._M_array = &local_88;
  local_88.first._M_str = *a;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}